

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O3

Abc_Obj_t * Abc_NtkBddFindCofactor(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode,int nLutSize)

{
  DdManager *dd;
  DdManager *ddDestination;
  bool bVar1;
  int iVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  DdNode *f;
  long lVar8;
  ulong uVar9;
  uint i;
  Abc_Obj_t *pFanin;
  int iVar10;
  int *piVar11;
  uint uVar12;
  
  uVar12 = (pNode->vFanins).nSize;
  if (uVar12 != nLutSize + 1U) {
    __assert_fail("Abc_ObjFaninNum(pNode) == nLutSize + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLutmin.c"
                  ,0x1fd,"Abc_Obj_t *Abc_NtkBddFindCofactor(Abc_Ntk_t *, Abc_Obj_t *, int)");
  }
  dd = (DdManager *)pNode->pNtk->pManFunc;
  ddDestination = (DdManager *)pNtkNew->pManFunc;
  if ((int)uVar12 < 1) {
    i = 0;
    pDVar4 = (DdNode *)0x0;
    pDVar5 = (DdNode *)0x0;
    bVar1 = false;
  }
  else {
    iVar10 = nLutSize + -2;
    i = 0;
    do {
      pDVar4 = Cudd_bddIthVar(dd,i);
      pDVar5 = Cudd_Cofactor(dd,(DdNode *)(pNode->field_5).pData,(DdNode *)((ulong)pDVar4 ^ 1));
      Cudd_Ref(pDVar5);
      pDVar4 = Cudd_Cofactor(dd,(DdNode *)(pNode->field_5).pData,pDVar4);
      Cudd_Ref(pDVar4);
      iVar2 = Cudd_SupportSize(dd,pDVar5);
      bVar1 = iVar2 <= iVar10;
      if ((iVar2 <= iVar10) || (iVar2 = Cudd_SupportSize(dd,pDVar4), iVar2 <= iVar10)) break;
      Cudd_RecursiveDeref(dd,pDVar5);
      Cudd_RecursiveDeref(dd,pDVar4);
      i = i + 1;
    } while ((int)i < (pNode->vFanins).nSize);
    uVar12 = (pNode->vFanins).nSize;
  }
  if (i == uVar12) {
    pObj_00 = (Abc_Obj_t *)0x0;
  }
  else {
    pDVar6 = pDVar4;
    if (bVar1) {
      pDVar6 = pDVar5;
    }
    pDVar6 = Cudd_Support(dd,pDVar6);
    Cudd_Ref(pDVar6);
    iVar10 = (pNode->vFanins).nSize;
    if (iVar10 < 1) {
      uVar12 = 0xffffffff;
    }
    else {
      uVar12 = 0;
      do {
        uVar3 = Cudd_ReadPerm(dd,uVar12);
        if (uVar12 != uVar3) {
          __assert_fail("i == Cudd_ReadPerm(ddOld, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLutmin.c"
                        ,0x217,"Abc_Obj_t *Abc_NtkBddFindCofactor(Abc_Ntk_t *, Abc_Obj_t *, int)");
        }
        if (uVar12 != i) {
          if (*(int *)((ulong)pDVar6 & 0xfffffffffffffffe) != 0x7fffffff) {
            uVar3 = Cudd_NodeReadIndex(pDVar6);
            piVar11 = (int *)((ulong)pDVar6 & 0xfffffffffffffffe);
            pDVar7 = pDVar6;
            while (uVar12 != uVar3) {
              pDVar7 = (pDVar7->type).kids.T;
              piVar11 = (int *)((ulong)pDVar7 & 0xfffffffffffffffe);
              if (*piVar11 == 0x7fffffff) goto LAB_0026b2c1;
              uVar3 = Cudd_NodeReadIndex(pDVar7);
            }
            if (*piVar11 != 0x7fffffff) goto LAB_0026b2a4;
          }
LAB_0026b2c1:
          iVar10 = (pNode->vFanins).nSize;
          goto LAB_0026b2da;
        }
LAB_0026b2a4:
        uVar12 = uVar12 + 1;
        iVar10 = (pNode->vFanins).nSize;
      } while ((int)uVar12 < iVar10);
      uVar12 = 0xffffffff;
    }
LAB_0026b2da:
    if (iVar10 <= (int)uVar12) {
      __assert_fail("iFreeVar != iCof && iFreeVar < Abc_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLutmin.c"
                    ,0x223,"Abc_Obj_t *Abc_NtkBddFindCofactor(Abc_Ntk_t *, Abc_Obj_t *, int)");
    }
    Cudd_RecursiveDeref(dd,pDVar6);
    pDVar6 = Extra_TransferLevelByLevel(dd,ddDestination,pDVar5);
    Cudd_Ref(pDVar6);
    pDVar7 = Extra_TransferLevelByLevel(dd,ddDestination,pDVar4);
    Cudd_Ref(pDVar7);
    Cudd_RecursiveDeref(dd,pDVar5);
    Cudd_RecursiveDeref(dd,pDVar4);
    pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
    if (0 < (pNode->vFanins).nSize) {
      lVar8 = 0;
      do {
        Abc_ObjAddFanin(pObj,*(Abc_Obj_t **)
                              ((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar8]] +
                              0x40));
        lVar8 = lVar8 + 1;
      } while (lVar8 < (pNode->vFanins).nSize);
    }
    pDVar5 = pDVar6;
    if (bVar1) {
      pDVar5 = pDVar7;
    }
    (pObj->field_5).pData = pDVar5;
    pObj_00 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
    if (0 < (pNode->vFanins).nSize) {
      uVar9 = 0;
      do {
        pFanin = pObj;
        if (uVar12 != uVar9) {
          pFanin = *(Abc_Obj_t **)
                    ((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar9]] + 0x40);
        }
        Abc_ObjAddFanin(pObj_00,pFanin);
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)(pNode->vFanins).nSize);
    }
    f = Cudd_bddIthVar(ddDestination,i);
    pDVar4 = Cudd_bddIthVar(ddDestination,uVar12);
    pDVar5 = pDVar6;
    if (!bVar1) {
      pDVar6 = pDVar4;
      pDVar5 = pDVar7;
      pDVar4 = pDVar7;
    }
    pDVar4 = Cudd_bddIte(ddDestination,f,pDVar4,pDVar6);
    (pObj_00->field_5).pData = pDVar4;
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(ddDestination,pDVar5);
  }
  return pObj_00;
}

Assistant:

Abc_Obj_t * Abc_NtkBddFindCofactor( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode, int nLutSize )
{
    Abc_Obj_t * pNodeBot, * pNodeTop;
    DdManager * ddOld = (DdManager *)pNode->pNtk->pManFunc;
    DdManager * ddNew = (DdManager *)pNtkNew->pManFunc;
    DdNode * bCof0 = NULL, * bCof1 = NULL, * bSupp, * bTemp, * bVar;
    DdNode * bCof0n, * bCof1n;
    int i, iCof, iFreeVar, fCof1Smaller = -1;
    assert( Abc_ObjFaninNum(pNode) == nLutSize + 1 );
    for ( iCof = 0; iCof < Abc_ObjFaninNum(pNode); iCof++ )
    {
        bVar  = Cudd_bddIthVar( ddOld, iCof );
        bCof0 = Cudd_Cofactor( ddOld, (DdNode *)pNode->pData, Cudd_Not(bVar) );  Cudd_Ref( bCof0 );
        bCof1 = Cudd_Cofactor( ddOld, (DdNode *)pNode->pData, bVar  );           Cudd_Ref( bCof1 );
        if ( Cudd_SupportSize( ddOld, bCof0 ) <= nLutSize - 2 )
        {
            fCof1Smaller = 0;
            break;
        }
        if ( Cudd_SupportSize( ddOld, bCof1 ) <= nLutSize - 2 )
        {
            fCof1Smaller = 1;
            break;
        }
        Cudd_RecursiveDeref( ddOld, bCof0 );
        Cudd_RecursiveDeref( ddOld, bCof1 );
    }
    if ( iCof == Abc_ObjFaninNum(pNode) )
        return NULL;
    // find unused variable
    bSupp = Cudd_Support( ddOld, fCof1Smaller? bCof1 : bCof0 );   Cudd_Ref( bSupp );
    iFreeVar = -1;
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
    {
        assert( i == Cudd_ReadPerm(ddOld, i) );
        if ( i == iCof )
            continue;
        for ( bTemp = bSupp; !Cudd_IsConstant(bTemp); bTemp = cuddT(bTemp) )
            if ( i == (int)Cudd_NodeReadIndex(bTemp) )
                break;
        if ( Cudd_IsConstant(bTemp) )
        {
            iFreeVar = i;
            break;
        }
    }
    assert( iFreeVar != iCof && iFreeVar < Abc_ObjFaninNum(pNode) );
    Cudd_RecursiveDeref( ddOld, bSupp );
    // transfer the cofactors
    bCof0n = Extra_TransferLevelByLevel( ddOld, ddNew, bCof0 ); Cudd_Ref( bCof0n );
    bCof1n = Extra_TransferLevelByLevel( ddOld, ddNew, bCof1 ); Cudd_Ref( bCof1n );
    Cudd_RecursiveDeref( ddOld, bCof0 );
    Cudd_RecursiveDeref( ddOld, bCof1 );
    // create bottom node
    pNodeBot = Abc_NtkCreateNode( pNtkNew );
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
        Abc_ObjAddFanin( pNodeBot, Abc_ObjFanin(pNode, i)->pCopy );
    pNodeBot->pData = fCof1Smaller? bCof0n : bCof1n;
    // create top node
    pNodeTop = Abc_NtkCreateNode( pNtkNew );
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
        if ( i == iFreeVar )           
            Abc_ObjAddFanin( pNodeTop, pNodeBot );
        else
            Abc_ObjAddFanin( pNodeTop, Abc_ObjFanin(pNode, i)->pCopy );
    // derive the new function
    pNodeTop->pData = Cudd_bddIte( ddNew, 
        Cudd_bddIthVar(ddNew, iCof), 
        fCof1Smaller? bCof1n : Cudd_bddIthVar(ddNew, iFreeVar), 
        fCof1Smaller? Cudd_bddIthVar(ddNew, iFreeVar) : bCof0n );
    Cudd_Ref( (DdNode *)pNodeTop->pData );
    Cudd_RecursiveDeref( ddNew, fCof1Smaller? bCof1n : bCof0n );
    return pNodeTop;
}